

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

String testing::internal::FormatForComparisonFailureMessage<unsigned_int,unsigned_int>
                 (uint *value,uint *param_2)

{
  void *__dest;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  String SVar2;
  string local_40;
  
  PrintToString<unsigned_int>(&local_40,param_2);
  __dest = operator_new__(local_40._M_string_length + 1);
  memcpy(__dest,local_40._M_dataplus._M_p,local_40._M_string_length);
  *(undefined1 *)((long)__dest + local_40._M_string_length) = 0;
  *(void **)value = __dest;
  *(size_type *)(value + 2) = local_40._M_string_length;
  sVar1 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
    sVar1 = extraout_RDX_00;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)value;
  return SVar2;
}

Assistant:

String FormatForComparisonFailureMessage(const T1& value,
                                         const T2& /* other_operand */) {
  // C++Builder compiles this incorrectly if the namespace isn't explicitly
  // given.
  return ::testing::PrintToString(value);
}